

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O0

void __thiscall absl::lts_20250127::crc_internal::CrcCordState::CrcCordState(CrcCordState *this)

{
  RefcountedRep *this_00;
  CrcCordState *this_local;
  
  this_00 = (RefcountedRep *)operator_new(0x68);
  RefcountedRep::RefcountedRep(this_00);
  this->refcounted_rep_ = this_00;
  return;
}

Assistant:

CrcCordState::CrcCordState() : refcounted_rep_(new RefcountedRep) {}